

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strfunc.h
# Opt level: O2

int rapidjson::internal::StrCmp<char>(char *s1,char *s2)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  long lVar4;
  char *__assertion;
  
  if (s1 == (char *)0x0) {
    __assertion = "s1 != 0";
    uVar3 = 0x38;
  }
  else {
    if (s2 != (char *)0x0) {
      lVar4 = 0;
      while( true ) {
        bVar1 = s1[lVar4];
        bVar2 = s2[lVar4];
        if ((bVar1 == 0) || (bVar1 != bVar2)) break;
        lVar4 = lVar4 + 1;
      }
      uVar3 = 0xffffffff;
      if (bVar2 <= bVar1) {
        uVar3 = (uint)(bVar2 < bVar1);
      }
      return uVar3;
    }
    __assertion = "s2 != 0";
    uVar3 = 0x39;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/strfunc.h"
                ,uVar3,"int rapidjson::internal::StrCmp(const Ch *, const Ch *) [Ch = char]");
}

Assistant:

inline int StrCmp(const Ch* s1, const Ch* s2) {
    RAPIDJSON_ASSERT(s1 != 0);
    RAPIDJSON_ASSERT(s2 != 0);
    while(*s1 && (*s1 == *s2)) { s1++; s2++; }
    return static_cast<unsigned>(*s1) < static_cast<unsigned>(*s2) ? -1 : static_cast<unsigned>(*s1) > static_cast<unsigned>(*s2);
}